

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad-helpers.c
# Opt level: O0

void pcap_freealldevs(pcap_if_t *alldevs)

{
  pcap_if *ppVar1;
  pcap_addr *ppVar2;
  pcap_addr_t *nextaddr;
  pcap_addr_t *curaddr;
  pcap_if_t *nextdev;
  pcap_if_t *curdev;
  pcap_if_t *alldevs_local;
  
  nextdev = alldevs;
  while (nextdev != (pcap_if_t *)0x0) {
    ppVar1 = nextdev->next;
    nextaddr = nextdev->addresses;
    while (nextaddr != (pcap_addr_t *)0x0) {
      ppVar2 = nextaddr->next;
      if (nextaddr->addr != (sockaddr *)0x0) {
        free(nextaddr->addr);
      }
      if (nextaddr->netmask != (sockaddr *)0x0) {
        free(nextaddr->netmask);
      }
      if (nextaddr->broadaddr != (sockaddr *)0x0) {
        free(nextaddr->broadaddr);
      }
      if (nextaddr->dstaddr != (sockaddr *)0x0) {
        free(nextaddr->dstaddr);
      }
      free(nextaddr);
      nextaddr = ppVar2;
    }
    free(nextdev->name);
    if (nextdev->description != (char *)0x0) {
      free(nextdev->description);
    }
    free(nextdev);
    nextdev = ppVar1;
  }
  return;
}

Assistant:

void
pcap_freealldevs(pcap_if_t *alldevs)
{
	pcap_if_t *curdev, *nextdev;
	pcap_addr_t *curaddr, *nextaddr;

	for (curdev = alldevs; curdev != NULL; curdev = nextdev) {
		nextdev = curdev->next;

		/*
		 * Free all addresses.
		 */
		for (curaddr = curdev->addresses; curaddr != NULL; curaddr = nextaddr) {
			nextaddr = curaddr->next;
			if (curaddr->addr)
				free(curaddr->addr);
			if (curaddr->netmask)
				free(curaddr->netmask);
			if (curaddr->broadaddr)
				free(curaddr->broadaddr);
			if (curaddr->dstaddr)
				free(curaddr->dstaddr);
			free(curaddr);
		}

		/*
		 * Free the name string.
		 */
		free(curdev->name);

		/*
		 * Free the description string, if any.
		 */
		if (curdev->description != NULL)
			free(curdev->description);

		/*
		 * Free the interface.
		 */
		free(curdev);
	}
}